

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

MemoryStream * __thiscall Assimp::Ogre::VertexData::VertexBuffer(VertexData *this,uint16_t source)

{
  bool bVar1;
  __shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Self local_30;
  _Self local_28;
  uint16_t local_1a;
  VertexData *pVStack_18;
  uint16_t source_local;
  VertexData *this_local;
  
  local_1a = source;
  pVStack_18 = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
       ::find(&this->vertexBindings,&local_1a);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
       ::end(&this->vertexBindings);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    this_00 = &std::
               map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
               ::operator[](&this->vertexBindings,&local_1a)->
               super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>;
    this_local = (VertexData *)
                 std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::get(this_00)
    ;
  }
  else {
    this_local = (VertexData *)0x0;
  }
  return (MemoryStream *)this_local;
}

Assistant:

MemoryStream *VertexData::VertexBuffer(uint16_t source)
{
    if (vertexBindings.find(source) != vertexBindings.end())
        return vertexBindings[source].get();
    return 0;
}